

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O0

void * resize(void *ptr,size_t size)

{
  ralloc_header *__ptr;
  ralloc_header *prVar1;
  ralloc_header *info;
  ralloc_header *old;
  ralloc_header *child;
  size_t size_local;
  void *ptr_local;
  
  __ptr = get_header(ptr);
  prVar1 = (ralloc_header *)realloc(__ptr,size + 0x30);
  if (prVar1 == (ralloc_header *)0x0) {
    ptr_local = (void *)0x0;
  }
  else {
    if ((prVar1 != __ptr) && (prVar1->parent != (ralloc_header *)0x0)) {
      if (prVar1->parent->child == __ptr) {
        prVar1->parent->child = prVar1;
      }
      if (prVar1->prev != (ralloc_header *)0x0) {
        prVar1->prev->next = prVar1;
      }
      if (prVar1->next != (ralloc_header *)0x0) {
        prVar1->next->prev = prVar1;
      }
    }
    for (old = prVar1->child; old != (ralloc_header *)0x0; old = old->next) {
      old->parent = prVar1;
    }
    ptr_local = prVar1 + 1;
  }
  return ptr_local;
}

Assistant:

static void *
resize(void *ptr, size_t size)
{
   ralloc_header *child, *old, *info;

   old = get_header(ptr);
   info = realloc(old, size + sizeof(ralloc_header));

   if (info == NULL)
      return NULL;

   /* Update parent and sibling's links to the reallocated node. */
   if (info != old && info->parent != NULL) {
      if (info->parent->child == old)
	 info->parent->child = info;

      if (info->prev != NULL)
	 info->prev->next = info;

      if (info->next != NULL)
	 info->next->prev = info;
   }

   /* Update child->parent links for all children */
   for (child = info->child; child != NULL; child = child->next)
      child->parent = info;

   return PTR_FROM_HEADER(info);
}